

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O2

size_t PrologEncoderMD::GetAllocaSize(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  IntConstOpnd *pIVar5;
  Opnd *this;
  
  if (instr->m_opcode != SUB) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x66,"(instr->m_opcode == Js::OpCode::SUB)",
                       "instr->m_opcode == Js::OpCode::SUB");
    if (!bVar2) goto LAB_005d2bcb;
    *puVar3 = 0;
  }
  this = instr->m_src1;
  if ((this == (Opnd *)0x0) || (instr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x67,"(instr->GetSrc1() && instr->GetSrc2())",
                       "instr->GetSrc1() && instr->GetSrc2()");
    if (!bVar2) goto LAB_005d2bcb;
    *puVar3 = 0;
    this = instr->m_src1;
  }
  pRVar4 = IR::Opnd::AsRegOpnd(this);
  if (pRVar4->m_reg == RegRSP) {
    bVar2 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
    if (!bVar2) goto LAB_005d2b12;
  }
  else {
LAB_005d2b12:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x69,
                       "(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd())"
                       ,
                       "instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd()"
                      );
    if (!bVar2) goto LAB_005d2bcb;
    *puVar3 = 0;
  }
  pIVar5 = IR::Opnd::AsIntConstOpnd(instr->m_src2);
  if (((pIVar5->super_EncodableOpnd<long>).m_value & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x6a,"(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0)",
                       "instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0");
    if (!bVar2) {
LAB_005d2bcb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pIVar5 = IR::Opnd::AsIntConstOpnd(instr->m_src2);
  return (pIVar5->super_EncodableOpnd<long>).m_value;
}

Assistant:

size_t PrologEncoderMD::GetAllocaSize(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::SUB);
    Assert(instr->GetSrc1() && instr->GetSrc2());
    Assert(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP &&
           instr->GetSrc2()->IsIntConstOpnd());
    Assert(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0);

    return instr->GetSrc2()->AsIntConstOpnd()->GetValue();
}